

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleTimestampCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  pointer pbVar5;
  ulong uVar6;
  string formatString;
  string result;
  cmTimestamp timestamp;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
  uVar4 = lVar3 >> 5;
  if (uVar4 < 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&formatString,"sub-command TIMESTAMP requires at least two arguments.",
               (allocator<char> *)&result);
    cmCommand::SetError(&this->super_cmCommand,&formatString);
LAB_00246efd:
    std::__cxx11::string::~string((string *)&formatString);
    return false;
  }
  if (5 < uVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&formatString,"sub-command TIMESTAMP takes at most four arguments.",
               (allocator<char> *)&result);
    cmCommand::SetError(&this->super_cmCommand,&formatString);
    goto LAB_00246efd;
  }
  formatString._M_dataplus._M_p = (pointer)&formatString.field_2;
  formatString._M_string_length = 0;
  formatString.field_2._M_local_buf[0] = '\0';
  uVar4 = 3;
  pbVar5 = pbVar1;
  if (lVar3 != 0x60) {
    bVar2 = std::operator!=(pbVar1 + 3,"UTC");
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (bVar2) {
      std::__cxx11::string::_M_assign((string *)&formatString);
      uVar4 = 4;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    }
  }
  uVar6 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5;
  if (uVar4 < uVar6) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&(pbVar5->_M_dataplus)._M_p + (ulong)(uint)((int)uVar4 << 5)),
                            "UTC");
    if (!bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&timestamp
                     ," TIMESTAMP sub-command does not recognize option ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&(((args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     (ulong)(uint)((int)uVar4 << 5)));
      std::operator+(&result,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &timestamp,".");
      std::__cxx11::string::~string((string *)&timestamp);
      cmCommand::SetError(&this->super_cmCommand,&result);
      std::__cxx11::string::~string((string *)&result);
      bVar2 = false;
      goto LAB_0024701f;
    }
  }
  cmTimestamp::FileModificationTime
            (&result,&timestamp,pbVar1[1]._M_dataplus._M_p,&formatString,uVar4 < uVar6);
  cmMakefile::AddDefinition((this->super_cmCommand).Makefile,pbVar1 + 2,result._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&result);
  bVar2 = true;
LAB_0024701f:
  std::__cxx11::string::~string((string *)&formatString);
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleTimestampCommand(
  std::vector<std::string> const& args)
{
  if (args.size() < 3) {
    this->SetError("sub-command TIMESTAMP requires at least two arguments.");
    return false;
  }
  if (args.size() > 5) {
    this->SetError("sub-command TIMESTAMP takes at most four arguments.");
    return false;
  }

  unsigned int argsIndex = 1;

  const std::string& filename = args[argsIndex++];

  const std::string& outputVariable = args[argsIndex++];

  std::string formatString;
  if (args.size() > argsIndex && args[argsIndex] != "UTC") {
    formatString = args[argsIndex++];
  }

  bool utcFlag = false;
  if (args.size() > argsIndex) {
    if (args[argsIndex] == "UTC") {
      utcFlag = true;
    } else {
      std::string e = " TIMESTAMP sub-command does not recognize option " +
        args[argsIndex] + ".";
      this->SetError(e);
      return false;
    }
  }

  cmTimestamp timestamp;
  std::string result =
    timestamp.FileModificationTime(filename.c_str(), formatString, utcFlag);
  this->Makefile->AddDefinition(outputVariable, result.c_str());

  return true;
}